

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathBoxAlgo.h
# Opt level: O1

Box<Imath_2_5::Vec3<float>_> *
Imath_2_5::transform<float,float>(Box<Imath_2_5::Vec3<float>_> *box,Matrix44<float> *m)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar9;
  float fVar10;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  Box<Imath_2_5::Vec3<float>_> *newBox;
  undefined4 in_ECX;
  int i;
  int iVar11;
  long lVar12;
  float *pfVar13;
  long lVar14;
  uint uVar15;
  uint uVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  undefined8 uVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float afStack_70 [2];
  Vec3<float> points [8];
  
  points[3].x = (box->min).x;
  points[7].x = (box->max).x;
  if ((((points[3].x <= points[7].x) &&
       (fVar17 = (box->min).y, pfVar13 = &(box->max).y, fVar17 < *pfVar13 || fVar17 == *pfVar13)) &&
      (fVar17 = (box->min).z, pfVar13 = &(box->max).z, fVar17 < *pfVar13 || fVar17 == *pfVar13)) &&
     (((points[3].x != -3.4028235e+38 || (NAN(points[3].x))) ||
      ((auVar23._4_4_ = -(uint)((box->min).z != -3.4028235e+38),
       auVar23._0_4_ = -(uint)((box->min).y != -3.4028235e+38),
       auVar23._8_4_ = -(uint)(points[7].x != 3.4028235e+38),
       auVar23._12_4_ = -(uint)((box->max).y != 3.4028235e+38), iVar11 = movmskps(in_ECX,auVar23),
       iVar11 != 0 || ((fVar17 = (box->max).z, fVar17 != 3.4028235e+38 || (NAN(fVar17))))))))) {
    fVar17 = m->x[0][3];
    if ((fVar17 == 0.0) &&
       (((((!NAN(fVar17) && (fVar18 = m->x[1][3], fVar18 == 0.0)) && (!NAN(fVar18))) &&
         ((fVar18 = m->x[2][3], fVar18 == 0.0 && (!NAN(fVar18))))) &&
        ((fVar18 = m->x[3][3], fVar18 == 1.0 && (!NAN(fVar18))))))) {
      (newBox->min).x = 3.4028235e+38;
      (newBox->min).y = 3.4028235e+38;
      *(undefined8 *)&(newBox->min).z = 0xff7fffff7f7fffff;
      (newBox->max).y = -3.4028235e+38;
      (newBox->max).z = -3.4028235e+38;
      lVar12 = 0;
      pfVar13 = (float *)m;
      do {
        fVar17 = m->x[3][lVar12];
        (&(newBox->max).x)[lVar12] = fVar17;
        (&(newBox->min).x)[lVar12] = fVar17;
        lVar14 = 0;
        fVar18 = fVar17;
        do {
          fVar24 = *(float *)((long)&(box->min).x + lVar14) * pfVar13[lVar14];
          fVar19 = pfVar13[lVar14] * *(float *)((long)&(box->max).x + lVar14);
          fVar25 = fVar24;
          if (fVar19 <= fVar24) {
            fVar25 = fVar19;
          }
          fVar17 = fVar17 + fVar25;
          if (fVar19 <= fVar24) {
            fVar19 = fVar24;
          }
          fVar18 = fVar18 + fVar19;
          lVar14 = lVar14 + 4;
        } while (lVar14 != 0xc);
        (&(newBox->min).x)[lVar12] = fVar17;
        (&(newBox->max).x)[lVar12] = fVar18;
        lVar12 = lVar12 + 1;
        pfVar13 = pfVar13 + 1;
      } while (lVar12 != 3);
      return newBox;
    }
    points[2].x = points[3].x;
    points[1].x = points[3].x;
    points[0].x = points[3].x;
    points[6].x = points[7].x;
    points[5].x = points[7].x;
    points[4].x = points[7].x;
    fVar4 = (box->min).y;
    fVar9 = (box->min).z;
    points[5].y = fVar4;
    points[1].y = fVar4;
    points[6].z = fVar9;
    points[4].y = fVar4;
    points[4].z = fVar9;
    points[2].z = fVar9;
    points[0].y = fVar4;
    points[0].z = fVar9;
    fVar5 = (box->max).y;
    fVar10 = (box->max).z;
    points[6].y = fVar5;
    points[2].y = fVar5;
    points[7].y = fVar5;
    points[7].z = fVar10;
    points[5].z = fVar10;
    points[3].y = fVar5;
    points[3].z = fVar10;
    points[1].z = fVar10;
    fVar18 = 3.4028235e+38;
    fVar19 = 3.4028235e+38;
    fVar25 = 3.4028235e+38;
    fVar24 = -3.4028235e+38;
    (newBox->min).x = 3.4028235e+38;
    (newBox->min).y = 3.4028235e+38;
    (newBox->min).z = 3.4028235e+38;
    (newBox->max).x = -3.4028235e+38;
    auVar23 = _DAT_0014a1b0;
    uVar20 = DAT_0014a1b0;
    (newBox->max).y = (float)(int)uVar20;
    (newBox->max).z = (float)(int)((ulong)uVar20 >> 0x20);
    uVar20 = *(undefined8 *)(m->x[0] + 1);
    uVar6 = *(undefined8 *)(m->x[1] + 1);
    uVar7 = *(undefined8 *)(m->x[2] + 1);
    uVar8 = *(undefined8 *)(m->x[3] + 1);
    lVar12 = 8;
    do {
      fVar1 = *(float *)((long)afStack_70 + lVar12);
      fVar2 = *(float *)((long)afStack_70 + lVar12 + 4);
      fVar3 = *(float *)((long)&points[0].x + lVar12);
      fVar27 = fVar3 * m->x[2][3] + fVar1 * fVar17 + fVar2 * m->x[1][3] + m->x[3][3];
      fVar26 = (fVar3 * m->x[2][0] + fVar1 * m->x[0][0] + fVar2 * m->x[1][0] + m->x[3][0]) / fVar27;
      auVar21._0_4_ =
           fVar3 * (float)uVar7 + fVar1 * (float)uVar20 + fVar2 * (float)uVar6 + (float)uVar8;
      auVar21._4_4_ =
           fVar3 * (float)((ulong)uVar7 >> 0x20) +
           fVar1 * (float)((ulong)uVar20 >> 0x20) + fVar2 * (float)((ulong)uVar6 >> 0x20) +
           (float)((ulong)uVar8 >> 0x20);
      auVar21._8_4_ = fVar3 * 0.0 + fVar1 * 0.0 + fVar2 * 0.0 + 0.0;
      auVar21._12_4_ = fVar3 * 0.0 + fVar1 * 0.0 + fVar2 * 0.0 + 0.0;
      auVar22._4_4_ = fVar27;
      auVar22._0_4_ = fVar27;
      auVar22._8_4_ = fVar27;
      auVar22._12_4_ = fVar27;
      auVar22 = divps(auVar21,auVar22);
      uVar15 = -(uint)(auVar22._0_4_ < fVar19);
      uVar16 = -(uint)(auVar22._4_4_ < fVar25);
      fVar18 = (float)(~-(uint)(fVar26 < fVar18) & (uint)fVar18 |
                      (uint)fVar26 & -(uint)(fVar26 < fVar18));
      fVar19 = (float)(~uVar15 & (uint)fVar19 | (uint)auVar22._0_4_ & uVar15);
      fVar25 = (float)(~uVar16 & (uint)fVar25 | (uint)auVar22._4_4_ & uVar16);
      fVar24 = (float)(~-(uint)(fVar24 < fVar26) & (uint)fVar24 |
                      (uint)fVar26 & -(uint)(fVar24 < fVar26));
      auVar23 = maxps(auVar22,auVar23);
      lVar12 = lVar12 + 0xc;
    } while (lVar12 != 0x68);
    (newBox->min).x = fVar18;
    (newBox->min).y = fVar19;
    (newBox->min).z = fVar25;
    (newBox->max).x = fVar24;
    (newBox->max).y = (float)(int)auVar23._0_8_;
    (newBox->max).z = (float)(int)((ulong)auVar23._0_8_ >> 0x20);
    return newBox;
  }
  (newBox->min).x = points[3].x;
  fVar17 = (box->min).z;
  (newBox->min).y = (box->min).y;
  (newBox->min).z = fVar17;
  (newBox->max).x = points[7].x;
  fVar17 = (box->max).z;
  (newBox->max).y = (box->max).y;
  (newBox->max).z = fVar17;
  return newBox;
}

Assistant:

Box< Vec3<S> >
transform (const Box< Vec3<S> > &box, const Matrix44<T> &m)
{
    //
    // Transform a 3D box by a matrix, and compute a new box that
    // tightly encloses the transformed box.
    //
    // If m is an affine transform, then we use James Arvo's fast
    // method as described in "Graphics Gems", Academic Press, 1990,
    // pp. 548-550.
    //

    //
    // A transformed empty box is still empty, and a transformed infinite box
    // is still infinite
    //

    if (box.isEmpty() || box.isInfinite())
	return box;

    //
    // If the last column of m is (0 0 0 1) then m is an affine
    // transform, and we use the fast Graphics Gems trick.
    //

    if (m[0][3] == 0 && m[1][3] == 0 && m[2][3] == 0 && m[3][3] == 1)
    {
	Box< Vec3<S> > newBox;

	for (int i = 0; i < 3; i++) 
        {
	    newBox.min[i] = newBox.max[i] = (S) m[3][i];

	    for (int j = 0; j < 3; j++) 
            {
		S a, b;

		a = (S) m[j][i] * box.min[j];
		b = (S) m[j][i] * box.max[j];

		if (a < b) 
                {
		    newBox.min[i] += a;
		    newBox.max[i] += b;
		}
		else 
                {
		    newBox.min[i] += b;
		    newBox.max[i] += a;
		}
	    }
	}

	return newBox;
    }

    //
    // M is a projection matrix.  Do things the naive way:
    // Transform the eight corners of the box, and find an
    // axis-parallel box that encloses the transformed corners.
    //

    Vec3<S> points[8];

    points[0][0] = points[1][0] = points[2][0] = points[3][0] = box.min[0];
    points[4][0] = points[5][0] = points[6][0] = points[7][0] = box.max[0];

    points[0][1] = points[1][1] = points[4][1] = points[5][1] = box.min[1];
    points[2][1] = points[3][1] = points[6][1] = points[7][1] = box.max[1];

    points[0][2] = points[2][2] = points[4][2] = points[6][2] = box.min[2];
    points[1][2] = points[3][2] = points[5][2] = points[7][2] = box.max[2];

    Box< Vec3<S> > newBox;

    for (int i = 0; i < 8; i++) 
	newBox.extendBy (points[i] * m);

    return newBox;
}